

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O2

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,BndryRegister *crse,int c_start,MultiFab *fine,int f_start,
          int bnd_start,int num_comp,int ratio,BCRec *bc,int max_order)

{
  (*(this->super_BndryData).super_BndryRegister._vptr_BndryRegister[8])();
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (BndryRegister&  crse,
                                 int             c_start,
                                 const MultiFab& fine,
                                 int             f_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 int             ratio,
                                 const BCRec&    bc,
                                 int             max_order)
{
    const IntVect& ratio_vect = ratio * IntVect::TheUnitVector();
    setBndryValues(crse,c_start,fine,f_start,bnd_start,num_comp,ratio_vect,bc,max_order);
}